

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O1

cbtVector3 orth(cbtVector3 *v)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float __x;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  cbtVector3 cVar13;
  int local_28;
  
  fVar1 = v->m_floats[0];
  fVar9 = v->m_floats[1];
  fVar2 = fVar9 + v->m_floats[2] * -0.0;
  auVar6 = ZEXT416((uint)v->m_floats[2]);
  auVar4 = vfmsub213ss_fma(ZEXT816(0) << 0x40,auVar6,ZEXT416((uint)fVar1));
  auVar3 = vfmadd213ss_fma(ZEXT816(0) << 0x40,ZEXT416((uint)fVar1),ZEXT416((uint)(fVar9 * -0.0)));
  auVar10 = vfmsub213ss_fma(ZEXT416((uint)fVar9),ZEXT816(0) << 0x40,auVar6);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * -0.0)),ZEXT816(0) << 0x40,auVar6);
  fVar1 = fVar9 * -0.0 + fVar1;
  fVar12 = auVar4._0_4_;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),ZEXT416((uint)fVar2),
                           ZEXT416((uint)fVar2));
  auVar4 = vfmadd231ss_fma(auVar4,auVar3,auVar3);
  fVar9 = auVar4._0_4_;
  if (fVar9 < 0.0) {
    fVar7 = sqrtf(fVar9);
  }
  else {
    auVar4 = vsqrtss_avx(auVar4,auVar4);
    fVar7 = auVar4._0_4_;
  }
  fVar11 = auVar6._0_4_;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar11)),auVar10,auVar10);
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
  __x = auVar6._0_4_;
  if (__x < 0.0) {
    fVar8 = sqrtf(__x);
  }
  else {
    auVar4 = vsqrtss_avx(auVar6,auVar6);
    fVar8 = auVar4._0_4_;
  }
  bVar5 = fVar8 < fVar7;
  auVar6._0_4_ = (float)((uint)bVar5 * (int)fVar9 + (uint)!bVar5 * (int)__x);
  local_28 = auVar3._0_4_;
  if (auVar6._0_4_ < 0.0) {
    fVar9 = sqrtf(auVar6._0_4_);
  }
  else {
    auVar3 = vsqrtss_avx(auVar6,auVar6);
    fVar9 = auVar3._0_4_;
  }
  fVar9 = 1.0 / fVar9;
  auVar3 = vinsertps_avx(ZEXT416((uint)((float)((uint)bVar5 * (int)fVar2 +
                                               (uint)!bVar5 * auVar10._0_4_) * fVar9)),
                         ZEXT416((uint)((float)((uint)bVar5 * (int)fVar12 +
                                               (uint)!bVar5 * (int)fVar11) * fVar9)),0x10);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
  auVar10._4_12_ = SUB1612(auVar4 << 0x40,4);
  auVar10._0_4_ = (float)((uint)bVar5 * local_28 + (uint)!bVar5 * (int)fVar1) * fVar9;
  cVar13.m_floats._0_8_ = auVar3._0_8_;
  cVar13.m_floats._8_8_ = auVar10._0_8_;
  return (cbtVector3)cVar13.m_floats;
}

Assistant:

cbtVector3 orth(const cbtVector3 &v)
{
	cbtVector3 a = cbtCross(v, cbtVector3(0, 0, 1));
	cbtVector3 b = cbtCross(v, cbtVector3(0, 1, 0));
	if (a.length() > b.length())
	{
		return a.normalized();
	}
	else
	{
		return b.normalized();
	}
}